

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

bool __thiscall
despot::HierarchyCPT::IsIdentityUnderConstraint(HierarchyCPT *this,NamedVar *var,int value)

{
  pointer ppTVar1;
  TabularCPT *pTVar2;
  ulong uVar3;
  char cVar4;
  undefined1 uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (*(this->super_CPT).super_Function.parents_.
       super__Vector_base<despot::NamedVar_*,_std::allocator<despot::NamedVar_*>_>._M_impl.
       super__Vector_impl_data._M_start == var) {
    pTVar2 = (this->cpts_).
             super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>._M_impl
             .super__Vector_impl_data._M_start[value];
    uVar5 = (**(code **)((long)(pTVar2->super_CPT).super_Function._vptr_Function + 0x80))
                      (pTVar2,var,value);
    return (bool)uVar5;
  }
  uVar3 = 0;
  do {
    uVar6 = uVar3;
    ppTVar1 = (this->cpts_).
              super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar7 = (long)(this->cpts_).
                  super__Vector_base<despot::TabularCPT_*,_std::allocator<despot::TabularCPT_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3;
    if (uVar7 <= uVar6) break;
    pTVar2 = ppTVar1[uVar6];
    cVar4 = (**(code **)((long)(pTVar2->super_CPT).super_Function._vptr_Function + 0x80))
                      (pTVar2,var,value);
    uVar3 = uVar6 + 1;
  } while (cVar4 != '\0');
  return uVar7 <= uVar6;
}

Assistant:

bool HierarchyCPT::IsIdentityUnderConstraint(const NamedVar* var,
	int value) const {
	if (var == parents_[0])
		return cpts_[value]->IsIdentityUnderConstraint(var, value);

	for (int i = 0; i < cpts_.size(); i++)
		if (!cpts_[i]->IsIdentityUnderConstraint(var, value))
			return false;
	return true;
}